

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

void disturb(player *p)

{
  uint32_t *puVar1;
  wchar_t wVar2;
  player_upkeep *ppVar3;
  
  cmd_cancel_repeat();
  wVar2 = p->upkeep->resting;
  if (L'\0' < wVar2 || 0xfffc < (ushort)wVar2) {
    p->upkeep->resting = L'\0';
    player_turns_rested = L'\0';
    player_rest_disturb = true;
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x8000;
  }
  ppVar3 = p->upkeep;
  if (ppVar3->running != L'\0') {
    ppVar3->running = L'\0';
    mem_free(ppVar3->steps);
    p->upkeep->steps = (int16_t *)0x0;
    cmdq_flush();
    event_signal(EVENT_PLAYERMOVED);
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 2;
    event_signal_point(EVENT_MAP,L'\xffffffff',L'\xffffffff');
  }
  event_signal(EVENT_INPUT_FLUSH);
  return;
}

Assistant:

void disturb(struct player *p)
{
	/* Cancel repeated commands */
	cmd_cancel_repeat();

	/* Cancel Resting */
	if (player_is_resting(p)) {
		player_resting_cancel(p, true);
		p->upkeep->redraw |= PR_STATE;
	}

	/* Cancel running */
	if (p->upkeep->running) {
		p->upkeep->running = 0;
		mem_free(p->upkeep->steps);
		p->upkeep->steps = NULL;

		/* Cancel queued commands */
		cmdq_flush();

		/* Check for new panel if appropriate */
		event_signal(EVENT_PLAYERMOVED);
		p->upkeep->update |= PU_TORCH;

		/* Mark the whole map to be redrawn */
		event_signal_point(EVENT_MAP, -1, -1);
	}

	/* Flush input */
	event_signal(EVENT_INPUT_FLUSH);
}